

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_pss.cc
# Opt level: O2

int x509_rsa_ctx_to_pss(EVP_MD_CTX *ctx,X509_ALGOR *algor)

{
  X509_ALGOR *a;
  int iVar1;
  int iVar2;
  int iVar3;
  RSA_PSS_PARAMS *a_00;
  ASN1_INTEGER *a_01;
  ASN1_STRING *pAVar4;
  X509_ALGOR *alg;
  ASN1_OBJECT *pAVar5;
  int saltlen;
  ASN1_STRING *os;
  ASN1_OCTET_STRING *local_48;
  EVP_MD *sigmd;
  EVP_MD *mgf1md;
  X509_ALGOR *algtmp;
  
  iVar1 = EVP_PKEY_CTX_get_signature_md(ctx->pctx,&sigmd);
  if (((iVar1 != 0) && (iVar1 = EVP_PKEY_CTX_get_rsa_mgf1_md(ctx->pctx,&mgf1md), iVar1 != 0)) &&
     (iVar1 = EVP_PKEY_CTX_get_rsa_pss_saltlen(ctx->pctx,&saltlen), iVar1 != 0)) {
    if ((sigmd == mgf1md) && (iVar1 = is_allowed_pss_md(sigmd), iVar1 != 0)) {
      iVar2 = EVP_MD_size((EVP_MD *)sigmd);
      iVar1 = iVar2;
      if ((saltlen == -1) || (iVar1 = saltlen, saltlen == iVar2)) {
        saltlen = iVar1;
        os = (ASN1_STRING *)0x0;
        a_00 = RSA_PSS_PARAMS_new();
        iVar1 = 0;
        iVar2 = 0;
        if (a_00 != (RSA_PSS_PARAMS *)0x0) {
          if (saltlen == 0x14) {
            __assert_fail("saltlen != 20",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                          ,0xb9,"int x509_rsa_ctx_to_pss(EVP_MD_CTX *, X509_ALGOR *)");
          }
          a_01 = ASN1_INTEGER_new();
          a_00->saltLength = a_01;
          if (((a_01 != (ASN1_INTEGER *)0x0) &&
              (iVar3 = ASN1_INTEGER_set_int64((ASN1_INTEGER *)a_01,(long)saltlen), iVar3 != 0)) &&
             (iVar3 = rsa_md_to_algor((X509_ALGOR **)a_00,sigmd), iVar1 = iVar2, iVar3 != 0)) {
            iVar2 = is_allowed_pss_md(mgf1md);
            if (iVar2 == 0) {
              __assert_fail("is_allowed_pss_md(mgf1md)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                            ,0x62,"int rsa_md_to_mgf1(X509_ALGOR **, const EVP_MD *)");
            }
            algtmp = (X509_ALGOR *)0x0;
            local_48 = (ASN1_STRING *)0x0;
            iVar2 = rsa_md_to_algor(&algtmp,mgf1md);
            a = algtmp;
            if ((iVar2 != 0) &&
               (pAVar4 = ASN1_item_pack(algtmp,(ASN1_ITEM *)&X509_ALGOR_it,&local_48),
               pAVar4 != (ASN1_STRING *)0x0)) {
              alg = X509_ALGOR_new();
              a_00->maskGenAlgorithm = alg;
              if (alg != (X509_ALGOR *)0x0) {
                pAVar5 = OBJ_nid2obj(0x38f);
                iVar2 = X509_ALGOR_set0(alg,pAVar5,0x10,local_48);
                if (iVar2 != 0) {
                  local_48 = (ASN1_STRING *)0x0;
                }
              }
            }
            ASN1_STRING_free(local_48);
            X509_ALGOR_free((X509_ALGOR *)a);
            if ((a_00->maskGenAlgorithm != (X509_ALGOR *)0x0) &&
               (pAVar4 = ASN1_item_pack(a_00,(ASN1_ITEM *)&RSA_PSS_PARAMS_it,
                                        (ASN1_OCTET_STRING **)&os), pAVar4 != (ASN1_STRING *)0x0)) {
              pAVar5 = OBJ_nid2obj(0x390);
              iVar2 = X509_ALGOR_set0((X509_ALGOR *)algor,pAVar5,0x10,os);
              if (iVar2 != 0) {
                os = (ASN1_STRING *)0x0;
                iVar1 = 1;
              }
            }
          }
        }
        RSA_PSS_PARAMS_free(a_00);
        ASN1_STRING_free((ASN1_STRING *)os);
        return iVar1;
      }
      iVar1 = 0xad;
    }
    else {
      iVar1 = 0xa6;
    }
    ERR_put_error(0xb,0,0x70,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                  ,iVar1);
  }
  return 0;
}

Assistant:

int x509_rsa_ctx_to_pss(EVP_MD_CTX *ctx, X509_ALGOR *algor) {
  const EVP_MD *sigmd, *mgf1md;
  int saltlen;
  if (!EVP_PKEY_CTX_get_signature_md(ctx->pctx, &sigmd) ||
      !EVP_PKEY_CTX_get_rsa_mgf1_md(ctx->pctx, &mgf1md) ||
      !EVP_PKEY_CTX_get_rsa_pss_saltlen(ctx->pctx, &saltlen)) {
    return 0;
  }

  if (sigmd != mgf1md || !is_allowed_pss_md(sigmd)) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
    return 0;
  }
  int md_len = (int)EVP_MD_size(sigmd);
  if (saltlen == -1) {
    saltlen = md_len;
  } else if (saltlen != md_len) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
    return 0;
  }

  int ret = 0;
  ASN1_STRING *os = NULL;
  RSA_PSS_PARAMS *pss = RSA_PSS_PARAMS_new();
  if (!pss) {
    goto err;
  }

  // The DEFAULT value is 20, but this does not match any supported digest.
  assert(saltlen != 20);
  pss->saltLength = ASN1_INTEGER_new();
  if (!pss->saltLength ||  //
      !ASN1_INTEGER_set_int64(pss->saltLength, saltlen)) {
    goto err;
  }

  if (!rsa_md_to_algor(&pss->hashAlgorithm, sigmd) ||
      !rsa_md_to_mgf1(&pss->maskGenAlgorithm, mgf1md)) {
    goto err;
  }

  // Finally create string with pss parameter encoding.
  if (!ASN1_item_pack(pss, ASN1_ITEM_rptr(RSA_PSS_PARAMS), &os)) {
    goto err;
  }

  if (!X509_ALGOR_set0(algor, OBJ_nid2obj(NID_rsassaPss), V_ASN1_SEQUENCE,
                       os)) {
    goto err;
  }
  os = NULL;
  ret = 1;

err:
  RSA_PSS_PARAMS_free(pss);
  ASN1_STRING_free(os);
  return ret;
}